

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeSorterMapFile(SortSubtask *pTask,SorterFile *pFile,u8 **pp)

{
  i64 in_RDX;
  sqlite3_file *in_RSI;
  long in_RDI;
  sqlite3_file *pFd;
  int rc;
  int iVar1;
  
  iVar1 = 0;
  if (((long)in_RSI[1].pMethods <= (long)*(int *)(*(long *)(*(long *)(in_RDI + 0x10) + 0x20) + 0xb8)
      ) && (2 < **(int **)in_RSI->pMethods)) {
    iVar1 = sqlite3OsFetch(in_RSI,in_RDX,0,(void **)in_RSI->pMethods);
  }
  return iVar1;
}

Assistant:

static int vdbeSorterMapFile(SortSubtask *pTask, SorterFile *pFile, u8 **pp){
  int rc = SQLITE_OK;
  if( pFile->iEof<=(i64)(pTask->pSorter->db->nMaxSorterMmap) ){
    sqlite3_file *pFd = pFile->pFd;
    if( pFd->pMethods->iVersion>=3 ){
      rc = sqlite3OsFetch(pFd, 0, (int)pFile->iEof, (void**)pp);
      testcase( rc!=SQLITE_OK );
    }
  }
  return rc;
}